

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O2

void __thiscall
mjs::string_object::add_own_property_names
          (string_object *this,vector<mjs::string,_std::allocator<mjs::string>_> *names,
          bool check_enumerable)

{
  gc_heap *h;
  wchar_t *pwVar1;
  wchar_t *extraout_RDX;
  uint uVar2;
  wstring_view wVar3;
  wstring_view local_70;
  wstring local_60;
  gc_heap_ptr_untyped local_40;
  
  if (this->is_v5_or_later_ == true) {
    wVar3 = view(this);
    pwVar1 = wVar3._M_str;
    h = (this->super_native_object).super_object.heap_;
    for (uVar2 = 0; (uint)wVar3._M_len != uVar2; uVar2 = uVar2 + 1) {
      index_string_abi_cxx11_(&local_60,(mjs *)(ulong)uVar2,(uint32_t)pwVar1);
      local_70._M_len = local_60._M_string_length;
      local_70._M_str = local_60._M_dataplus._M_p;
      string::string((string *)&local_40,h,&local_70);
      std::vector<mjs::string,_std::allocator<mjs::string>_>::emplace_back<mjs::string>
                (names,(string *)&local_40);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_40);
      std::__cxx11::wstring::~wstring((wstring *)&local_60);
      pwVar1 = extraout_RDX;
    }
  }
  native_object::add_own_property_names(&this->super_native_object,names,check_enumerable);
  return;
}

Assistant:

void add_own_property_names(std::vector<string>& names, bool check_enumerable) const override {
        if (is_v5_or_later_) {
            const auto s = view();
            auto& h = heap();
            for (auto i = 0U, l = static_cast<uint32_t>(s.length()); i < l; ++i) {
                names.push_back(string{h, index_string(i)});
            }
        }
        native_object::add_own_property_names(names, check_enumerable);
    }